

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_-1,_false>::Block
          (Block<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,__1,_false> *this,
          Matrix<double,_1,_3,_1,_1,_3> *xpr,Index startRow,Index startCol,Index blockRows,
          Index blockCols)

{
  internal::BlockImpl_dense<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,_-1,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<double,_1,_3,_1,_1,_3>,_1,__1,_false,_true> *)this,
                  xpr,startRow,startCol,blockRows,blockCols);
  if (blockRows != 1) {
    __assert_fail("(RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows) && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                  ,0x91,
                  "Eigen::Block<Eigen::Matrix<double, 1, 3>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, 1, 3>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
                 );
  }
  if ((((-1 < startRow) && (startRow == 0)) && (-1 < (blockCols | startCol))) &&
     (startCol <= 3 - blockCols)) {
    return;
  }
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Block.h"
                ,0x93,
                "Eigen::Block<Eigen::Matrix<double, 1, 3>, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, 1, 3>, BlockRows = 1, BlockCols = -1, InnerPanel = false]"
               );
}

Assistant:

Block(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Impl(xpr, startRow, startCol, blockRows, blockCols)
    {
      eigen_assert((RowsAtCompileTime==Dynamic || RowsAtCompileTime==blockRows)
          && (ColsAtCompileTime==Dynamic || ColsAtCompileTime==blockCols));
      eigen_assert(startRow >= 0 && blockRows >= 0 && startRow  <= xpr.rows() - blockRows
          && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols);
    }